

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

bool __thiscall json::Value::has(Value *this,IString x)

{
  bool bVar1;
  size_type sVar2;
  Value *this_local;
  IString x_local;
  
  x_local.str._M_len = (size_t)x.str._M_str;
  this_local = (Value *)x.str._M_len;
  bVar1 = isObject(this);
  if (!bVar1) {
    __assert_fail("isObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/json.h"
                  ,0x191,"bool json::Value::has(IString)");
  }
  sVar2 = std::
          unordered_map<wasm::IString,_json::Value::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>_>
          ::count((unordered_map<wasm::IString,_json::Value::Ref,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>_>
                   *)(this->field_1).arr,(key_type *)&this_local);
  return sVar2 != 0;
}

Assistant:

bool has(IString x) {
    assert(isObject());
    return obj->count(x) > 0;
  }